

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O0

void __thiscall
StackTraceTableTest_Basic_Test::~StackTraceTableTest_Basic_Test
          (StackTraceTableTest_Basic_Test *this)

{
  StackTraceTableTest_Basic_Test *this_local;
  
  ~StackTraceTableTest_Basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StackTraceTableTest, Basic) {
  StackTraceTableTestHelper h;

  // Empty table
  static const uintptr_t k1[] = {0};
  h.CheckTracesAndReset(k1, arraysize(k1));

  tcmalloc::StackTrace t1;
  t1.size = static_cast<uintptr_t>(1024);
  t1.depth = static_cast<uintptr_t>(2);
  t1.stack[0] = reinterpret_cast<void*>(1);
  t1.stack[1] = reinterpret_cast<void*>(2);

  tcmalloc::StackTrace t2;
  t2.size = static_cast<uintptr_t>(512);
  t2.depth = static_cast<uintptr_t>(2);
  t2.stack[0] = reinterpret_cast<void*>(2);
  t2.stack[1] = reinterpret_cast<void*>(1);

  // Table w/ just t1
  h.AddTrace(t1);
  static const uintptr_t k2[] = {1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k2, arraysize(k2));

  // Table w/ t1, t2
  h.AddTrace(t1);
  h.AddTrace(t2);
  static const uintptr_t k3[] = {1, 512, 2, 2, 1, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k3, arraysize(k3));

  // Table w/ t1, t3
  // Same stack as t1, but w/ different size
  tcmalloc::StackTrace t3;
  t3.size = static_cast<uintptr_t>(2);
  t3.depth = static_cast<uintptr_t>(2);
  t3.stack[0] = reinterpret_cast<void*>(1);
  t3.stack[1] = reinterpret_cast<void*>(2);

  h.AddTrace(t1);
  h.AddTrace(t3);
  static const uintptr_t k5[] = {1, 2, 2, 1, 2, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k5, arraysize(k5));
}